

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_> __thiscall
flow::lang::Parser::varDecl(Parser *this)

{
  bool bVar1;
  pointer this_00;
  SourceLocation *pSVar2;
  ASTNode *this_01;
  Parser *in_RSI;
  undefined1 local_88 [8];
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> initializer;
  string name;
  undefined1 local_50 [8];
  SourceLocation loc;
  Parser *this_local;
  
  this_00 = std::unique_ptr<flow::lang::Lexer,_std::default_delete<flow::lang::Lexer>_>::operator->
                      (&in_RSI->lexer_);
  pSVar2 = Lexer::location(this_00);
  SourceLocation::SourceLocation((SourceLocation *)local_50,pSVar2);
  bVar1 = consume(in_RSI,Var);
  if (bVar1) {
    bVar1 = consume(in_RSI,Ident);
    if (bVar1) {
      stringValue_abi_cxx11_((string *)&initializer,in_RSI);
      bVar1 = consume(in_RSI,Assign);
      if (bVar1) {
        expr((Parser *)local_88);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_88);
        if (bVar1) {
          this_01 = &std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                     operator->((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                 *)local_88)->super_ASTNode;
          pSVar2 = ASTNode::location(this_01);
          SourceLocation::update((SourceLocation *)local_50,&pSVar2->end);
          consume(in_RSI,Semicolon);
          std::
          make_unique<flow::lang::VariableSym,std::__cxx11::string&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,flow::SourceLocation&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     &initializer,(SourceLocation *)local_88);
        }
        else {
          std::unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>>::
          unique_ptr<std::default_delete<flow::lang::VariableSym>,void>
                    ((unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>>
                      *)this,(nullptr_t)0x0);
        }
        std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
                  ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_88)
        ;
      }
      else {
        std::unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>>::
        unique_ptr<std::default_delete<flow::lang::VariableSym>,void>
                  ((unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>>
                    *)this,(nullptr_t)0x0);
      }
      std::__cxx11::string::~string((string *)&initializer);
    }
    else {
      std::unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>>::
      unique_ptr<std::default_delete<flow::lang::VariableSym>,void>
                ((unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>> *
                 )this,(nullptr_t)0x0);
    }
  }
  else {
    std::unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>>::
    unique_ptr<std::default_delete<flow::lang::VariableSym>,void>
              ((unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>> *)
               this,(nullptr_t)0x0);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_50);
  return (__uniq_ptr_data<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>,_true,_true>
          )(__uniq_ptr_data<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VariableSym> Parser::varDecl() {
  SourceLocation loc(lexer_->location());

  if (!consume(Token::Var)) return nullptr;

  if (!consume(Token::Ident)) return nullptr;

  std::string name = stringValue();

  if (!consume(Token::Assign)) return nullptr;

  std::unique_ptr<Expr> initializer = expr();
  if (!initializer) return nullptr;

  loc.update(initializer->location().end);
  consume(Token::Semicolon);

  return std::make_unique<VariableSym>(name, std::move(initializer), loc);
}